

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b382dd::HandleGlobalMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  string *psVar1;
  OutType infoType_00;
  ulong uVar2;
  cmMakefile *pcVar3;
  cmake *this;
  cmState *this_00;
  cmValue value;
  cmake *cm;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *propertyName_local;
  string *variable_local;
  string *psStack_20;
  OutType infoType_local;
  string *name_local;
  cmExecutionStatus *status_local;
  
  local_38 = propertyName;
  propertyName_local = variable;
  variable_local._4_4_ = infoType;
  psStack_20 = name;
  name_local = (string *)status;
  uVar2 = std::__cxx11::string::empty();
  psVar1 = name_local;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"given name for GLOBAL scope.",&local_59);
    cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    status_local._7_1_ = false;
  }
  else {
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
    this = cmMakefile::GetCMakeInstance(pcVar3);
    infoType_00 = variable_local._4_4_;
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
    psVar1 = propertyName_local;
    this_00 = cmake::GetState(this);
    value = cmState::GetGlobalProperty(this_00,local_38);
    status_local._7_1_ = StoreResult<cmValue>(infoType_00,pcVar3,psVar1,value);
  }
  return status_local._7_1_;
}

Assistant:

bool HandleGlobalMode(cmExecutionStatus& status, const std::string& name,
                      OutType infoType, const std::string& variable,
                      const std::string& propertyName)
{
  if (!name.empty()) {
    status.SetError("given name for GLOBAL scope.");
    return false;
  }

  // Get the property.
  cmake* cm = status.GetMakefile().GetCMakeInstance();
  return StoreResult(infoType, status.GetMakefile(), variable,
                     cm->GetState()->GetGlobalProperty(propertyName));
}